

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::GetTargetDirectDepends
          (cmComputeTargetDepends *this,cmGeneratorTarget *t,cmTargetDependSet *deps)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pointer pcVar6;
  pair<std::_Rb_tree_iterator<cmTargetDepend>,_bool> pVar7;
  cmTargetDepend local_38;
  
  p_Var1 = &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)[*(cmGeneratorTarget **)(p_Var5 + 1) < t]) {
    if (*(cmGeneratorTarget **)(p_Var5 + 1) >= t) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, t < *(cmGeneratorTarget **)(p_Var4 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    __assert_fail("tii != this->TargetIndex.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmComputeTargetDepends.cxx"
                  ,0x92,
                  "void cmComputeTargetDepends::GetTargetDirectDepends(const cmGeneratorTarget *, cmTargetDependSet &)"
                 );
  }
  iVar2 = *(int *)&p_Var5[1]._M_parent;
  pcVar3 = (this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar6 = *(pointer *)
            &pcVar3[iVar2].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  if (pcVar6 != *(pointer *)
                 ((long)&pcVar3[iVar2].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                         super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8)) {
    do {
      local_38.Target =
           (this->Targets).
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           ._M_impl.super__Vector_impl_data._M_start[pcVar6->Dest];
      local_38.Link = false;
      local_38.Util = false;
      pVar7 = std::
              _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
              ::_M_insert_unique<cmTargetDepend>
                        ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          *)deps,&local_38);
      if (pcVar6->Strong == true) {
        *(undefined1 *)((long)&pVar7.first._M_node._M_node[1]._M_parent + 1) = 1;
      }
      else {
        *(undefined1 *)&pVar7.first._M_node._M_node[1]._M_parent = 1;
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != *(pointer *)
                        ((long)&pcVar3[iVar2].
                                super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                                super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8));
  }
  return;
}

Assistant:

void cmComputeTargetDepends::GetTargetDirectDepends(cmGeneratorTarget const* t,
                                                    cmTargetDependSet& deps)
{
  // Lookup the index for this target.  All targets should be known by
  // this point.
  std::map<cmGeneratorTarget const*, int>::const_iterator tii =
    this->TargetIndex.find(t);
  assert(tii != this->TargetIndex.end());
  int i = tii->second;

  // Get its final dependencies.
  EdgeList const& nl = this->FinalGraph[i];
  for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
    cmGeneratorTarget const* dep = this->Targets[*ni];
    cmTargetDependSet::iterator di = deps.insert(dep).first;
    di->SetType(ni->IsStrong());
  }
}